

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

EqualsMatcher *
Catch::Matchers::Equals(EqualsMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  CasedString local_48;
  Choice local_1c;
  string *psStack_18;
  Choice caseSensitivity_local;
  string *str_local;
  
  local_1c = caseSensitivity;
  psStack_18 = str;
  str_local = (string *)__return_storage_ptr__;
  StdString::CasedString::CasedString(&local_48,str,caseSensitivity);
  StdString::EqualsMatcher::EqualsMatcher(__return_storage_ptr__,&local_48);
  StdString::CasedString::~CasedString(&local_48);
  return __return_storage_ptr__;
}

Assistant:

StdString::EqualsMatcher Equals( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::EqualsMatcher( StdString::CasedString( str, caseSensitivity) );
    }